

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestCoverageHandler::ShouldIDoCoverage
          (cmCTestCoverageHandler *this,char *file,char *srcDir,char *binDir)

{
  cmCTest *pcVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  _Alloc_hider remote;
  char *in_R8;
  pointer this_00;
  string fFile;
  string relPath;
  string checkDir;
  string fSrcDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string ndc;
  string fBinDir;
  string fileDir;
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::string::string((string *)&cmCTestLog_msg,file,(allocator *)&fSrcDir);
  bVar2 = IsFilteredOut(this,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (!bVar2) {
    this_00 = (this->CustomCoverageExcludeRegex).
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (this_00 ==
          (this->CustomCoverageExcludeRegex).
          super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string((string *)&cmCTestLog_msg,srcDir,(allocator *)&fBinDir);
        cmsys::SystemTools::CollapseFullPath(&fSrcDir,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::string::string((string *)&cmCTestLog_msg,binDir,(allocator *)&fFile);
        cmsys::SystemTools::CollapseFullPath(&fBinDir,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::string::string((string *)&cmCTestLog_msg,file,(allocator *)&fileDir);
        cmsys::SystemTools::CollapseFullPath(&fFile,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        bVar2 = cmsys::SystemTools::IsSubDirectory(&fFile,&fSrcDir);
        bVar3 = cmsys::SystemTools::IsSubDirectory(&fFile,&fBinDir);
        cmsys::SystemTools::GetFilenamePath(&fileDir,&fFile);
        checkDir._M_dataplus._M_p = (pointer)&checkDir.field_2;
        checkDir._M_string_length = 0;
        checkDir.field_2._M_local_buf[0] = '\0';
        if ((bVar2 && bVar3) || (bVar3 || bVar2)) {
          std::__cxx11::string::_M_assign((string *)&checkDir);
        }
        remote._M_p = checkDir._M_dataplus._M_p;
        cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
                  (&ndc,(cmSystemTools *)".NoDartCoverage",fFile._M_dataplus._M_p,
                   checkDir._M_dataplus._M_p,in_R8);
        if (ndc._M_string_length == 0) {
          relPath._M_dataplus._M_p = (pointer)&relPath.field_2;
          relPath._M_string_length = 0;
          relPath.field_2._M_local_buf[0] = '\0';
          if (checkDir._M_string_length == 0) {
            std::__cxx11::string::_M_assign((string *)&relPath);
          }
          else {
            cmSystemTools::RelativePath_abi_cxx11_
                      ((string *)&cmCTestLog_msg,(cmSystemTools *)checkDir._M_dataplus._M_p,
                       fFile._M_dataplus._M_p,remote._M_p);
            std::__cxx11::string::operator=((string *)&relPath,(string *)&cmCTestLog_msg);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          }
          std::operator==(&checkDir,&fSrcDir);
          std::__cxx11::string::_M_assign((string *)&checkDir);
          std::operator+(&local_228,&checkDir,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCTestLog_msg,&local_228,&relPath);
          std::__cxx11::string::operator=((string *)&fFile,(string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&local_228);
          cmsys::SystemTools::GetFilenamePath((string *)&cmCTestLog_msg,&fFile);
          std::__cxx11::string::operator=((string *)&fFile,(string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          _Var4 = std::operator==(&fileDir,&fFile);
          bVar2 = true;
          if (!_Var4) {
            cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
                      ((string *)&cmCTestLog_msg,(cmSystemTools *)".NoDartCoverage",
                       fFile._M_dataplus._M_p,checkDir._M_dataplus._M_p,in_R8);
            std::__cxx11::string::operator=((string *)&ndc,(string *)&cmCTestLog_msg);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg);
            if (ndc._M_string_length != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Found: ");
              poVar5 = std::operator<<(poVar5,(string *)&ndc);
              poVar5 = std::operator<<(poVar5," so skip coverage of: ");
              poVar5 = std::operator<<(poVar5,file);
              std::endl<char,std::char_traits<char>>(poVar5);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x13f,local_228._M_dataplus._M_p,
                           (this->super_cmCTestGenericHandler).Quiet);
              std::__cxx11::string::~string((string *)&local_228);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              bVar2 = false;
            }
          }
          std::__cxx11::string::~string((string *)&relPath);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Found: ");
          poVar5 = std::operator<<(poVar5,(string *)&ndc);
          poVar5 = std::operator<<(poVar5," so skip coverage of ");
          poVar5 = std::operator<<(poVar5,file);
          std::endl<char,std::char_traits<char>>(poVar5);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x118,relPath._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&relPath);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&ndc);
        std::__cxx11::string::~string((string *)&checkDir);
        std::__cxx11::string::~string((string *)&fileDir);
        std::__cxx11::string::~string((string *)&fFile);
        std::__cxx11::string::~string((string *)&fBinDir);
        std::__cxx11::string::~string((string *)&fSrcDir);
        return bVar2;
      }
      bVar2 = cmsys::RegularExpression::find(this_00,file);
      this_00 = this_00 + 1;
    } while (!bVar2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"  File ");
    poVar5 = std::operator<<(poVar5,file);
    poVar5 = std::operator<<(poVar5," is excluded in CTestCustom.ctest");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0xee,fSrcDir._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&fSrcDir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  return false;
}

Assistant:

bool cmCTestCoverageHandler::ShouldIDoCoverage(const char* file,
  const char* srcDir,
  const char* binDir)
{
  if(this->IsFilteredOut(file))
    {
    return false;
    }

  std::vector<cmsys::RegularExpression>::iterator sit;
  for ( sit = this->CustomCoverageExcludeRegex.begin();
    sit != this->CustomCoverageExcludeRegex.end(); ++ sit )
    {
    if ( sit->find(file) )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "  File " << file
        << " is excluded in CTestCustom.ctest" << std::endl;, this->Quiet);
      return false;
      }
    }

  std::string fSrcDir = cmSystemTools::CollapseFullPath(srcDir);
  std::string fBinDir = cmSystemTools::CollapseFullPath(binDir);
  std::string fFile = cmSystemTools::CollapseFullPath(file);
  bool sourceSubDir = cmSystemTools::IsSubDirectory(fFile,
    fSrcDir);
  bool buildSubDir = cmSystemTools::IsSubDirectory(fFile,
    fBinDir);
  // Always check parent directory of the file.
  std::string fileDir = cmSystemTools::GetFilenamePath(fFile);
  std::string checkDir;

  // We also need to check the binary/source directory pair.
  if ( sourceSubDir && buildSubDir )
    {
    if ( fSrcDir.size() > fBinDir.size() )
      {
      checkDir = fSrcDir;
      }
    else
      {
      checkDir = fBinDir;
      }
    }
  else if ( sourceSubDir )
    {
    checkDir = fSrcDir;
    }
  else if ( buildSubDir )
    {
    checkDir = fBinDir;
    }
  std::string ndc
    = cmSystemTools::FileExistsInParentDirectories(".NoDartCoverage",
      fFile.c_str(), checkDir.c_str());
  if (!ndc.empty())
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Found: " << ndc
      << " so skip coverage of " << file << std::endl, this->Quiet);
    return false;
    }

  // By now checkDir should be set to parent directory of the file.
  // Get the relative path to the file an apply it to the opposite directory.
  // If it is the same as fileDir, then ignore, otherwise check.
  std::string relPath;
  if(!checkDir.empty())
    {
    relPath = cmSystemTools::RelativePath(checkDir.c_str(),
                                          fFile.c_str());
    }
  else
    {
    relPath = fFile;
    }
  if ( checkDir == fSrcDir )
    {
    checkDir = fBinDir;
    }
  else
    {
    checkDir = fSrcDir;
    }
  fFile = checkDir + "/" + relPath;
  fFile = cmSystemTools::GetFilenamePath(fFile);

  if ( fileDir == fFile )
    {
    // This is in-source build, so we trust the previous check.
    return true;
    }

  ndc = cmSystemTools::FileExistsInParentDirectories(".NoDartCoverage",
    fFile.c_str(), checkDir.c_str());
  if (!ndc.empty())
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Found: " << ndc
      << " so skip coverage of: " << file << std::endl, this->Quiet);
    return false;
    }
  // Ok, nothing in source tree, nothing in binary tree
  return true;
}